

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O0

void __thiscall sock_tests::send_and_receive::test_method(send_and_receive *this)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long in_FS_OFFSET;
  Sock *sock1moved;
  Sock *sock0moved;
  Sock *sock1;
  Sock *sock0;
  int s [2];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  assertion_result *in_stack_fffffffffffffe38;
  assertion_result *this_00;
  lazy_ostream *in_stack_fffffffffffffe50;
  assertion_result *line_num;
  const_string *file;
  unit_test_log_t *this_01;
  int *in_stack_fffffffffffffe80;
  Sock *in_stack_fffffffffffffef0;
  Sock *in_stack_fffffffffffffef8;
  lazy_ostream local_f0 [2];
  undefined4 local_cc;
  const_string local_90 [2];
  lazy_ostream local_70 [2];
  undefined4 local_4c;
  unit_test_log_t local_30 [2];
  const_string local_20;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CreateSocketPair(in_stack_fffffffffffffe80);
  plVar2 = (long *)operator_new(0x10);
  Sock::Sock((Sock *)in_stack_fffffffffffffe28,0);
  plVar3 = (long *)operator_new(0x10);
  Sock::Sock((Sock *)in_stack_fffffffffffffe28,0);
  SendAndRecvMessage(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  plVar4 = (long *)operator_new(0x10);
  Sock::Sock((Sock *)in_stack_fffffffffffffe28,(Sock *)0xaf2264);
  plVar5 = (long *)operator_new(0x10);
  Sock::Sock((Sock *)in_stack_fffffffffffffe28,0);
  (**(code **)(*plVar5 + 0x10))(plVar5,plVar3);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
  }
  SendAndRecvMessage(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
  }
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 8))();
  }
  do {
    file = &local_20;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               (pointer)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (unsigned_long)in_stack_fffffffffffffe28);
    this_01 = local_30;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,file,(size_t)line_num,(const_string *)in_stack_fffffffffffffe50);
    local_4c = local_10;
    SocketIsClosed((SOCKET *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               (pointer)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (unsigned_long)in_stack_fffffffffffffe28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               (pointer)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (unsigned_long)in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xffffffffffffffb8,local_70,local_90,0x7c,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffe28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)boost::unit_test::(anonymous_namespace)::unit_test_log,
               (pointer)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (unsigned_long)in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,file,(size_t)line_num,(const_string *)in_stack_fffffffffffffe50);
    local_cc = local_c;
    SocketIsClosed((SOCKET *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    boost::test_tools::assertion_result::assertion_result(this_00,(bool)in_stack_fffffffffffffe37);
    in_stack_fffffffffffffe50 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (unsigned_long)in_stack_fffffffffffffe28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (unsigned_long)in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xffffffffffffff38,local_f0,
               (const_string *)&stack0xfffffffffffffef0,0x7d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffe28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(send_and_receive)
{
    int s[2];
    CreateSocketPair(s);

    Sock* sock0 = new Sock(s[0]);
    Sock* sock1 = new Sock(s[1]);

    SendAndRecvMessage(*sock0, *sock1);

    Sock* sock0moved = new Sock(std::move(*sock0));
    Sock* sock1moved = new Sock(INVALID_SOCKET);
    *sock1moved = std::move(*sock1);

    delete sock0;
    delete sock1;

    SendAndRecvMessage(*sock1moved, *sock0moved);

    delete sock0moved;
    delete sock1moved;

    BOOST_CHECK(SocketIsClosed(s[0]));
    BOOST_CHECK(SocketIsClosed(s[1]));
}